

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O0

void list_extensions(int api,int major,int minor)

{
  char *pcVar1;
  GLFWglproc p_Var2;
  PFNGLGETSTRINGIPROC glGetStringi;
  GLubyte *extensions;
  uint local_18;
  GLint count;
  int i;
  int minor_local;
  int major_local;
  int api_local;
  
  count = minor;
  i = major;
  minor_local = api;
  pcVar1 = get_client_api_name(api);
  printf("%s context supported extensions:\n",pcVar1);
  if ((minor_local == 0x30001) && (2 < i)) {
    p_Var2 = glfwGetProcAddress("glGetStringi");
    if (p_Var2 == (GLFWglproc)0x0) {
      glfwTerminate();
      exit(1);
    }
    glGetIntegerv(0x821d,(long)&extensions + 4);
    for (local_18 = 0; (int)local_18 < extensions._4_4_; local_18 = local_18 + 1) {
      pcVar1 = (char *)(*p_Var2)(0x1f03,(ulong)local_18);
      puts(pcVar1);
    }
  }
  else {
    for (glGetStringi = (PFNGLGETSTRINGIPROC)glGetString(0x1f03);
        *glGetStringi != (_func_GLubyte_ptr_GLenum_GLuint)0x0; glGetStringi = glGetStringi + 1) {
      if (*glGetStringi == (_func_GLubyte_ptr_GLenum_GLuint)0x20) {
        putchar(10);
      }
      else {
        putchar((uint)(byte)*glGetStringi);
      }
    }
  }
  putchar(10);
  return;
}

Assistant:

static void list_extensions(int api, int major, int minor)
{
    int i;
    GLint count;
    const GLubyte* extensions;

    printf("%s context supported extensions:\n", get_client_api_name(api));

    if (api == GLFW_OPENGL_API && major > 2)
    {
        PFNGLGETSTRINGIPROC glGetStringi = (PFNGLGETSTRINGIPROC) glfwGetProcAddress("glGetStringi");
        if (!glGetStringi)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glGetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
            puts((const char*) glGetStringi(GL_EXTENSIONS, i));
    }
    else
    {
        extensions = glGetString(GL_EXTENSIONS);
        while (*extensions != '\0')
        {
            if (*extensions == ' ')
                putchar('\n');
            else
                putchar(*extensions);

            extensions++;
        }
    }

    putchar('\n');
}